

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ARMDisassembler.c
# Opt level: O2

DecodeStatus DecodeBranchImmInstruction(MCInst *Inst,uint Insn,uint64_t Address,void *Decoder)

{
  DecodeStatus DVar1;
  uint64_t Address_00;
  uint uVar2;
  
  uVar2 = Insn * 4 & 0x3fffffc;
  if (Insn >> 0x1c == 0xf) {
    MCInst_setOpcode(Inst,0x3b);
    MCOperand_CreateImm0(Inst,(long)((ulong)(uVar2 | Insn >> 0x17 & 2) << 0x26) >> 0x26);
    DVar1 = MCDisassembler_Success;
  }
  else {
    MCOperand_CreateImm0(Inst,(long)((ulong)uVar2 << 0x26) >> 0x26);
    DVar1 = DecodePredicateOperand(Inst,Insn >> 0x1c,Address_00,Decoder);
    DVar1 = *(DecodeStatus *)(&DAT_001cd960 + (ulong)DVar1 * 4);
  }
  return DVar1;
}

Assistant:

static DecodeStatus DecodeBranchImmInstruction(MCInst *Inst, unsigned Insn,
		uint64_t Address, const void *Decoder)
{
	DecodeStatus S = MCDisassembler_Success;

	unsigned pred = fieldFromInstruction_4(Insn, 28, 4);
	unsigned imm = fieldFromInstruction_4(Insn, 0, 24) << 2;

	if (pred == 0xF) {
		MCInst_setOpcode(Inst, ARM_BLXi);
		imm |= fieldFromInstruction_4(Insn, 24, 1) << 1;
		MCOperand_CreateImm0(Inst, SignExtend32(imm, 26));
		return S;
	}

	MCOperand_CreateImm0(Inst, SignExtend32(imm, 26));
	if (!Check(&S, DecodePredicateOperand(Inst, pred, Address, Decoder)))
		return MCDisassembler_Fail;

	return S;
}